

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O1

int ui_entry_combiner_lookup(char *name)

{
  bool bVar1;
  int iVar2;
  int unaff_EBP;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  iVar5 = 9;
  do {
    if (iVar4 == iVar5) {
      unaff_EBP = 0;
      bVar1 = false;
    }
    else {
      iVar3 = (iVar4 + iVar5) / 2;
      iVar2 = strcmp(combiners[iVar3].name,name);
      if (iVar2 == 0) {
        unaff_EBP = iVar3 + 1;
        bVar1 = false;
      }
      else {
        if (iVar2 < 0) {
          iVar4 = iVar3 + 1;
          iVar3 = iVar5;
        }
        bVar1 = true;
        iVar5 = iVar3;
      }
    }
  } while (bVar1);
  return unaff_EBP;
}

Assistant:

int ui_entry_combiner_lookup(const char *name)
{
	/* Sorted alphabetically so use a binary search. */
	int ilow = 0, ihigh = N_ELEMENTS(combiners);

	while (1) {
		int imid, cmp;

		if (ilow == ihigh) {
			return 0;
		}
		imid = (ilow + ihigh) / 2;
		cmp = strcmp(combiners[imid].name, name);
		if (cmp == 0) {
			return imid + 1;
		}
		if (cmp < 0) {
			ilow = imid + 1;
		} else {
			ihigh = imid;
		}
	}
}